

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matinv.c
# Opt level: O0

MATRIX mat_inv(MATRIX a)

{
  int iVar1;
  MATRIX A_00;
  MATRIX A_01;
  MATRIX P_00;
  long in_RDI;
  int n;
  int i;
  MATRIX P;
  MATRIX C;
  MATRIX B;
  MATRIX A;
  int iVar2;
  undefined4 in_stack_ffffffffffffffcc;
  undefined8 in_stack_ffffffffffffffd0;
  MATRIX in_stack_ffffffffffffffd8;
  MATRIX local_8;
  
  iVar1 = (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20);
  iVar2 = *(int *)(in_RDI + -4);
  A_00 = mat_copy(in_stack_ffffffffffffffd8);
  A_01 = mat_creat((int)((ulong)in_stack_ffffffffffffffd8 >> 0x20),(int)in_stack_ffffffffffffffd8,
                   iVar1);
  local_8 = mat_creat((int)((ulong)in_stack_ffffffffffffffd8 >> 0x20),(int)in_stack_ffffffffffffffd8
                      ,iVar1);
  P_00 = mat_creat((int)((ulong)local_8 >> 0x20),(int)local_8,iVar1);
  iVar1 = mat_lu(A_00,P_00);
  if (iVar1 == -1) {
    mat_free((MATRIX)CONCAT44(in_stack_ffffffffffffffcc,iVar2));
    mat_free((MATRIX)CONCAT44(in_stack_ffffffffffffffcc,iVar2));
    mat_free((MATRIX)CONCAT44(in_stack_ffffffffffffffcc,iVar2));
    mat_free((MATRIX)CONCAT44(in_stack_ffffffffffffffcc,iVar2));
    local_8 = (MATRIX)0x0;
  }
  else {
    for (iVar1 = 0; iVar1 < iVar2; iVar1 = iVar1 + 1) {
      mat_fill(A_01,0);
      *A_01[iVar1] = 1.0;
      mat_backsubs1(A_00,A_01,local_8,P_00,iVar1);
    }
    mat_free((MATRIX)CONCAT44(iVar1,iVar2));
    mat_free((MATRIX)CONCAT44(iVar1,iVar2));
    mat_free((MATRIX)CONCAT44(iVar1,iVar2));
  }
  return local_8;
}

Assistant:

MATRIX mat_inv( MATRIX a )
{
	MATRIX	A, B, C, P;
	int	i, n;

	n = MatCol(a);
	A = mat_copy(a);
	B = mat_creat( n, 1, UNDEFINED );
	C = mat_creat( n, n, UNDEFINED );
	P = mat_creat( n, 1, UNDEFINED );

	/*
	*	- LU-decomposition -
	*	also check for singular matrix
	*/
	if (mat_lu(A, P) == -1)
		{
		mat_free(A);
		mat_free(B);
		mat_free(C);
		mat_free(P);

		return (NULL);
		}

	for (i=0; i<n; i++)
		{
		mat_fill(B, ZERO_MATRIX);
		B[i][0] = 1.0;
		mat_backsubs1( A, B, C, P, i );
		}

	mat_free(A);
	mat_free(B);
	mat_free(P);
	return (C);
}